

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_3fPoint * __thiscall ON_3fPoint::operator=(ON_3fPoint *this,float *p)

{
  if (p != (float *)0x0) {
    this->x = *p;
    this->y = p[1];
    this->z = p[2];
    return this;
  }
  this->z = 0.0;
  this->x = 0.0;
  this->y = 0.0;
  return this;
}

Assistant:

ON_3fPoint& ON_3fPoint::operator=(const float* p)
{
  if ( p ) {
    x = p[0];
    y = p[1];
    z = p[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}